

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Gl_Choice.cxx
# Opt level: O1

void fl_set_gl_context(Fl_Window *w,GLXContext context)

{
  if ((cached_context == context) && (cached_window == w)) {
    return;
  }
  cached_context = context;
  cached_window = w;
  if (w->i != (Fl_X *)0x0) {
    glXMakeCurrent(fl_display,w->i->xid);
    return;
  }
  glXMakeCurrent(fl_display,0);
  return;
}

Assistant:

void fl_set_gl_context(Fl_Window* w, GLContext context) {
  if (context != cached_context || w != cached_window) {
    cached_context = context;
    cached_window = w;
#  if defined(USE_X11)
    glXMakeCurrent(fl_display, fl_xid(w), context);
#  elif defined(WIN32)
    wglMakeCurrent(Fl_X::i(w)->private_dc, context);
#  elif defined(__APPLE_QUARTZ__)
    Fl_X::GLcontext_makecurrent(context);
#  else
#   error unsupported platform
#  endif
  }
}